

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_prepare.cpp
# Opt level: O1

void __thiscall mocker::CodegenPreparation::naiveStrengthReduction(CodegenPreparation *this)

{
  int iVar1;
  FunctionModule *pFVar2;
  _func_int **pp_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _List_node_base *p_Var5;
  ArithBinaryInst *pAVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  shared_ptr<mocker::ir::Addr> lhs;
  shared_ptr<mocker::ir::IntLiteral> lit;
  shared_ptr<mocker::ir::Addr> rhs;
  undefined1 local_99;
  ArithBinaryInst *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  IntLiteral local_88;
  shared_ptr<mocker::ir::Addr> local_78;
  OpType local_64;
  shared_ptr<mocker::ir::IntLiteral> local_60;
  IntLiteral local_50;
  _List_node_base *local_40;
  _List_node_base *local_38;
  
  pFVar2 = (this->super_FuncPass).func;
  local_38 = (pFVar2->bbs).
             super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
             _M_impl._M_node.super__List_node_base._M_next;
  local_40 = (_List_node_base *)&pFVar2->bbs;
  if (local_38 != local_40) {
    do {
      p_Var5 = local_38 + 1;
      for (p_Var8 = local_38[1]._M_prev; p_Var8 != (_List_node_base *)&p_Var5->_M_prev;
          p_Var8 = p_Var8->_M_next) {
        p_Var9 = p_Var8[1]._M_next;
        if (*(int *)&p_Var9->_M_prev == 5) {
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[1]._M_prev;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
        }
        else {
          p_Var9 = (_List_node_base *)0x0;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (p_Var9 != (_List_node_base *)0x0) {
          local_88.super_Addr._vptr_Addr = (_func_int **)p_Var9[3]._M_next;
          local_88.val = *(int64_t *)((long)(p_Var9 + 3) + 8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.val !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.val)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.val)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.val)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.val)->_M_use_count + 1;
            }
          }
          local_50.super_Addr._vptr_Addr = (_func_int **)p_Var9[4]._M_next;
          local_50.val = *(int64_t *)((long)(p_Var9 + 4) + 8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.val !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.val)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.val)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.val)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.val)->_M_use_count + 1;
            }
          }
          ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>&>
                    (&local_78,&local_88);
          if (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          else {
            iVar1 = *(int *)((long)(p_Var9 + 2) + 8);
            if (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (iVar1 != 8) {
              pp_Var3 = local_50.super_Addr._vptr_Addr;
              p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.val;
              local_50.super_Addr._vptr_Addr = local_88.super_Addr._vptr_Addr;
              local_50.val = local_88.val;
              local_88.super_Addr._vptr_Addr = pp_Var3;
              local_88.val = (int64_t)p_Var4;
            }
          }
          ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>&>
                    (&local_78,&local_50);
          iVar1 = *(int *)((long)(p_Var9 + 2) + 8);
          if (iVar1 - 7U < 2) {
            if ((local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                 (element_type *)0x0) &&
               (pp_Var3 = local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr[1]._vptr_Addr, 0 < (long)pp_Var3)) {
              iVar12 = -1;
              if (((ulong)pp_Var3 & (long)pp_Var3 - 1U) == 0) {
                bVar13 = false;
                iVar12 = 0;
                if (((ulong)pp_Var3 & 1) == 0) {
                  uVar11 = 0xffffffff;
                  do {
                    uVar10 = uVar11;
                    if (uVar10 == 6) goto LAB_0015c79d;
                    uVar11 = uVar10 + 1;
                  } while (((uint)pp_Var3 >> ((byte)uVar11 & 0x1f) & 2) == 0);
                  bVar13 = 6 < uVar11;
                  iVar12 = uVar10 + 2;
                }
                if (bVar13) {
LAB_0015c79d:
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/codegen_prepare.cpp"
                                ,0x9c,
                                "int mocker::(anonymous namespace)::getNonzeroPos(std::uint64_t)");
                }
              }
              if (iVar12 != -1) {
                local_64 = (iVar1 != 7) + Shl;
                local_60.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
                local_60.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
                (local_60.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count = 1;
                (local_60.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count = 1;
                (local_60.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base =
                     (_func_int **)&PTR___Sp_counted_ptr_inplace_001f0ce8;
                local_60.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)
                         (local_60.
                          super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 1);
                local_60.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0d38;
                local_60.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[1]._M_use_count = (int)(long)iVar12;
                local_60.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[1]._M_weak_count = (int)((ulong)(long)iVar12 >> 0x20);
                local_98 = (ArithBinaryInst *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::ir::ArithBinaryInst,std::allocator<mocker::ir::ArithBinaryInst>,std::shared_ptr<mocker::ir::Reg>const&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::IntLiteral>>
                          (&_Stack_90,&local_98,(allocator<mocker::ir::ArithBinaryInst> *)&local_99,
                           (shared_ptr<mocker::ir::Reg> *)((long)(p_Var9 + 1) + 8),&local_64,
                           (shared_ptr<mocker::ir::Addr> *)&local_88,&local_60);
                _Var7._M_pi = _Stack_90._M_pi;
                pAVar6 = local_98;
                local_98 = (ArithBinaryInst *)0x0;
                _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[1]._M_prev;
                p_Var8[1]._M_next = (_List_node_base *)pAVar6;
                p_Var8[1]._M_prev = (_List_node_base *)_Var7._M_pi;
                if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                }
                _Var7._M_pi = local_60.
                              super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi;
                if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
                  _Var7._M_pi = local_60.
                                super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
                }
                goto LAB_0015c725;
              }
            }
          }
          else if (((iVar1 == 5) &&
                   (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    != (element_type *)0x0)) &&
                  (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   [1]._vptr_Addr == (_func_int **)0x0)) {
            local_98 = (ArithBinaryInst *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::ir::Assign,std::allocator<mocker::ir::Assign>,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Addr>&>
                      (&_Stack_90,(Assign **)&local_98,(allocator<mocker::ir::Assign> *)&local_60,
                       (shared_ptr<mocker::ir::Reg> *)((long)(p_Var9 + 1) + 8),
                       (shared_ptr<mocker::ir::Addr> *)&local_88);
            _Var7._M_pi = _Stack_90._M_pi;
            pAVar6 = local_98;
            local_98 = (ArithBinaryInst *)0x0;
            _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[1]._M_prev;
            p_Var8[1]._M_next = (_List_node_base *)pAVar6;
            p_Var8[1]._M_prev = (_List_node_base *)_Var7._M_pi;
            _Var7._M_pi = _Stack_90._M_pi;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
              _Var7._M_pi = _Stack_90._M_pi;
            }
LAB_0015c725:
            if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
            }
          }
          if (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.val !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.val);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.val !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.val);
          }
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      local_38 = local_38->_M_next;
    } while (local_38 != local_40);
  }
  return;
}

Assistant:

void CodegenPreparation::naiveStrengthReduction() {
  for (auto &bb : func.getMutableBBs()) {
    for (auto &inst : bb.getMutableInsts()) {
      auto binary = ir::dyc<ir::ArithBinaryInst>(inst);
      if (!binary)
        continue;
      auto lhs = binary->getLhs(), rhs = binary->getRhs();
      // Associativity is required here
      if (ir::dyc<ir::IntLiteral>(lhs) &&
          binary->getOp() != ir::ArithBinaryInst::Div)
        std::swap(lhs, rhs);
      auto lit = ir::dyc<ir::IntLiteral>(rhs);

      if (binary->getOp() == ir::ArithBinaryInst::Mul ||
          binary->getOp() == ir::ArithBinaryInst::Div) {
        if (!lit || lit->getVal() <= 0)
          continue;
        auto pos = getNonzeroPos(lit->getVal());
        if (pos == -1)
          continue;
        inst = std::make_shared<ir::ArithBinaryInst>(
            binary->getDest(),
            binary->getOp() == ir::ArithBinaryInst::Mul
                ? ir::ArithBinaryInst::Shl
                : ir::ArithBinaryInst::Shr,
            lhs, std::make_shared<ir::IntLiteral>(pos));
        continue;
      }

      if (binary->getOp() == ir::ArithBinaryInst::Add && lit &&
          lit->getVal() == 0) {
        inst = std::make_shared<ir::Assign>(binary->getDest(), lhs);
        continue;
      }
    }
  }
}